

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O1

int __thiscall spdlog::details::file_helper::open(file_helper *this,char *__file,int __oflag,...)

{
  filename_t *pfVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  FILE *pFVar6;
  FILE *pFVar7;
  FILE *extraout_RAX;
  int *piVar8;
  long *plVar9;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  int iVar12;
  filename_t local_a0;
  int local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_7c = __oflag;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)this->fd_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    if ((this->event_handlers_).before_close.super__Function_base._M_manager != (_Manager_type)0x0)
    {
      local_a0._M_dataplus._M_p = (pointer)this->fd_;
      (*(this->event_handlers_).before_close._M_invoker)
                ((_Any_data *)&(this->event_handlers_).before_close,&this->filename_,
                 (_IO_FILE **)&local_a0);
    }
    fclose((FILE *)this->fd_);
    this->fd_ = (FILE *)0x0;
    if ((this->event_handlers_).after_close.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->event_handlers_).after_close._M_invoker)
                ((_Any_data *)&(this->event_handlers_).after_close,&this->filename_);
    }
  }
  pfVar1 = &this->filename_;
  std::__cxx11::string::_M_assign((string *)pfVar1);
  if ((this->event_handlers_).before_open.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->event_handlers_).before_open._M_invoker)((_Any_data *)&this->event_handlers_,pfVar1);
  }
  paVar2 = &local_a0.field_2;
  local_78 = pfVar1;
  if (0 < this->open_tries_) {
    iVar12 = 0;
    do {
      lVar5 = std::__cxx11::string::find_last_of(__file,0x1ba340,0xffffffffffffffff);
      if (lVar5 == -1) {
        local_a0._M_string_length = 0;
        local_a0.field_2._M_allocated_capacity =
             local_a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_a0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_a0,(ulong)__file);
      }
      os::create_dir(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((char)local_7c == '\0') {
LAB_0012dc76:
        local_a0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"ab","");
        pFVar7 = fopen(*(char **)__file,local_a0._M_dataplus._M_p);
        this->fd_ = (FILE *)pFVar7;
        pFVar6 = pFVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          pFVar6 = extraout_RAX;
        }
        iVar4 = (int)pFVar6;
        if (pFVar7 != (FILE *)0x0) {
          if ((this->event_handlers_).after_open.super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            local_a0._M_dataplus._M_p = (pointer)this->fd_;
            iVar4 = (*(this->event_handlers_).after_open._M_invoker)
                              ((_Any_data *)&(this->event_handlers_).after_open,local_78,
                               (_IO_FILE **)&local_a0);
          }
          return iVar4;
        }
        uVar10 = (ulong)this->open_interval_;
        if (uVar10 != 0) {
          local_a0._M_dataplus._M_p = (pointer)(uVar10 / 1000);
          local_a0._M_string_length = (uVar10 % 1000) * 1000000;
          do {
            iVar4 = nanosleep((timespec *)&local_a0,(timespec *)&local_a0);
            if (iVar4 != -1) break;
            piVar8 = __errno_location();
          } while (*piVar8 == 4);
        }
      }
      else {
        local_a0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"wb","");
        pFVar6 = fopen(*(char **)__file,local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (pFVar6 != (FILE *)0x0) {
          fclose(pFVar6);
          goto LAB_0012dc76;
        }
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < this->open_tries_);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar3 = (this->filename_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (this->filename_)._M_string_length);
  std::operator+(&local_50,"Failed opening file ",&local_70);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_a0._M_dataplus._M_p = (pointer)*plVar9;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == paVar11) {
    local_a0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_a0.field_2._8_8_ = plVar9[3];
    local_a0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_a0._M_string_length = plVar9[1];
  *plVar9 = (long)paVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  piVar8 = __errno_location();
  throw_spdlog_ex(&local_a0,*piVar8);
}

Assistant:

SPDLOG_INLINE void file_helper::open(const filename_t &fname, bool truncate) {
    close();
    filename_ = fname;

    auto *mode = SPDLOG_FILENAME_T("ab");
    auto *trunc_mode = SPDLOG_FILENAME_T("wb");

    if (event_handlers_.before_open) {
        event_handlers_.before_open(filename_);
    }
    for (int tries = 0; tries < open_tries_; ++tries) {
        // create containing folder if not exists already.
        os::create_dir(os::dir_name(fname));
        if (truncate) {
            // Truncate by opening-and-closing a tmp file in "wb" mode, always
            // opening the actual log-we-write-to in "ab" mode, since that
            // interacts more politely with eternal processes that might
            // rotate/truncate the file underneath us.
            std::FILE *tmp;
            if (os::fopen_s(&tmp, fname, trunc_mode)) {
                continue;
            }
            std::fclose(tmp);
        }
        if (!os::fopen_s(&fd_, fname, mode)) {
            if (event_handlers_.after_open) {
                event_handlers_.after_open(filename_, fd_);
            }
            return;
        }

        details::os::sleep_for_millis(open_interval_);
    }

    throw_spdlog_ex("Failed opening file " + os::filename_to_str(filename_) + " for writing",
                    errno);
}